

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O0

void uv__udp_sendmsg(uv_udp_t *handle)

{
  int *piVar1;
  bool bVar2;
  ssize_t local_70;
  ssize_t size;
  QUEUE *q;
  msghdr h;
  uv_udp_send_t *req;
  uv_udp_t *handle_local;
  
  uv_once(&once,uv__udp_mmsg_init);
  if (uv__sendmmsg_avail == 0) {
    while (handle->write_queue != (void **)handle->write_queue[0]) {
      if (handle->write_queue[0] == (void *)0x0) {
        __assert_fail("q != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmlibuv/src/unix/udp.c"
                      ,0x1a8,"void uv__udp_sendmsg(uv_udp_t *)");
      }
      h._48_8_ = (long)handle->write_queue[0] + -0x50;
      if (h._48_8_ == 0) {
        __assert_fail("req != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmlibuv/src/unix/udp.c"
                      ,0x1ab,"void uv__udp_sendmsg(uv_udp_t *)");
      }
      memset(&q,0,0x38);
      if (*(short *)(h._48_8_ + 0x60) == 0) {
        q = (QUEUE *)0x0;
        h.msg_name._0_4_ = 0;
      }
      else {
        q = (QUEUE *)(h._48_8_ + 0x60);
        if (*(short *)(h._48_8_ + 0x60) == 10) {
          h.msg_name._0_4_ = 0x1c;
        }
        else if (*(short *)(h._48_8_ + 0x60) == 2) {
          h.msg_name._0_4_ = 0x10;
        }
        else {
          if (*(short *)(h._48_8_ + 0x60) != 1) {
            __assert_fail("0 && \"unsupported address family\"",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmlibuv/src/unix/udp.c"
                          ,0x1ba,"void uv__udp_sendmsg(uv_udp_t *)");
          }
          h.msg_name._0_4_ = 0x6e;
        }
      }
      h._8_8_ = *(undefined8 *)(h._48_8_ + 0xe8);
      h.msg_iov = (iovec *)(ulong)*(uint *)(h._48_8_ + 0xe0);
      do {
        local_70 = sendmsg((handle->io_watcher).fd,(msghdr *)&q,0);
        bVar2 = false;
        if (local_70 == -1) {
          piVar1 = __errno_location();
          bVar2 = *piVar1 == 4;
        }
      } while (bVar2);
      if (local_70 == -1) {
        piVar1 = __errno_location();
        if (*piVar1 == 0xb) {
          return;
        }
        piVar1 = __errno_location();
        if (*piVar1 == 0xb) {
          return;
        }
        piVar1 = __errno_location();
        if (*piVar1 == 0x69) {
          return;
        }
      }
      if (local_70 == -1) {
        piVar1 = __errno_location();
        local_70 = (ssize_t)-*piVar1;
      }
      *(ssize_t *)(h._48_8_ + 0xf0) = local_70;
      **(undefined8 **)(h._48_8_ + 0x58) = *(undefined8 *)(h._48_8_ + 0x50);
      *(undefined8 *)(*(long *)(h._48_8_ + 0x50) + 8) = *(undefined8 *)(h._48_8_ + 0x58);
      *(void ***)(h._48_8_ + 0x50) = handle->write_completed_queue;
      *(void **)(h._48_8_ + 0x58) = handle->write_completed_queue[1];
      **(long **)(h._48_8_ + 0x58) = h._48_8_ + 0x50;
      handle->write_completed_queue[1] = (void *)(h._48_8_ + 0x50);
      uv__io_feed(handle->loop,&handle->io_watcher);
    }
  }
  else {
    uv__udp_sendmmsg(handle);
  }
  return;
}

Assistant:

static void uv__udp_sendmsg(uv_udp_t* handle) {
  uv_udp_send_t* req;
  struct msghdr h;
  QUEUE* q;
  ssize_t size;

#if HAVE_MMSG
  uv_once(&once, uv__udp_mmsg_init);
  if (uv__sendmmsg_avail) {
    uv__udp_sendmmsg(handle);
    return;
  }
#endif

  while (!QUEUE_EMPTY(&handle->write_queue)) {
    q = QUEUE_HEAD(&handle->write_queue);
    assert(q != NULL);

    req = QUEUE_DATA(q, uv_udp_send_t, queue);
    assert(req != NULL);

    memset(&h, 0, sizeof h);
    if (req->addr.ss_family == AF_UNSPEC) {
      h.msg_name = NULL;
      h.msg_namelen = 0;
    } else {
      h.msg_name = &req->addr;
      if (req->addr.ss_family == AF_INET6)
        h.msg_namelen = sizeof(struct sockaddr_in6);
      else if (req->addr.ss_family == AF_INET)
        h.msg_namelen = sizeof(struct sockaddr_in);
      else if (req->addr.ss_family == AF_UNIX)
        h.msg_namelen = sizeof(struct sockaddr_un);
      else {
        assert(0 && "unsupported address family");
        abort();
      }
    }
    h.msg_iov = (struct iovec*) req->bufs;
    h.msg_iovlen = req->nbufs;

    do {
      size = sendmsg(handle->io_watcher.fd, &h, 0);
    } while (size == -1 && errno == EINTR);

    if (size == -1) {
      if (errno == EAGAIN || errno == EWOULDBLOCK || errno == ENOBUFS)
        break;
    }

    req->status = (size == -1 ? UV__ERR(errno) : size);

    /* Sending a datagram is an atomic operation: either all data
     * is written or nothing is (and EMSGSIZE is raised). That is
     * why we don't handle partial writes. Just pop the request
     * off the write queue and onto the completed queue, done.
     */
    QUEUE_REMOVE(&req->queue);
    QUEUE_INSERT_TAIL(&handle->write_completed_queue, &req->queue);
    uv__io_feed(handle->loop, &handle->io_watcher);
  }
}